

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonnetfmt.cpp
# Opt level: O3

void version(ostream *o)

{
  char *__s;
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Jsonnet reformatter ",0x14);
  __s = jsonnet_version();
  if (__s == (char *)0x0) {
    std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(o,__s,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)o + -0x18) + (char)o);
  std::ostream::put((char)o);
  std::ostream::flush();
  return;
}

Assistant:

void version(std::ostream &o)
{
    o << "Jsonnet reformatter " << jsonnet_version() << std::endl;
}